

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  undefined1 auVar1 [16];
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  void *pvVar5;
  FileDescriptor *pFVar6;
  uint uVar7;
  byte bVar8;
  slot_type *psVar9;
  undefined1 uVar10;
  pointer pLVar11;
  pointer pLVar12;
  slot_type *psVar13;
  long extraout_RDX;
  uint uVar14;
  ushort uVar15;
  
  psVar2 = (slot_type *)a->ctrl_;
  if ((psVar2 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = (slot_type *)b->ctrl_;
    if ((psVar3 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)psVar3 < '\0')) goto LAB_0020ee13;
    if (psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar3 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_0020edfc:
      return psVar2 == psVar3;
    }
    if ((psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (psVar3 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_0020edfc;
      if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar4 = (b->field_1).slot_;
        if (psVar2 == (slot_type *)&kSooControl) {
          if ((slot_type *)a == psVar4) goto LAB_0020edfc;
        }
        else {
          psVar13 = psVar4;
          psVar9 = psVar3;
          b = (iterator *)(slot_type *)a;
          if (psVar3 < psVar2) {
            psVar13 = (slot_type *)a;
            psVar9 = psVar2;
            b = (iterator *)psVar4;
          }
          if ((psVar9 < b) && (b <= psVar13)) goto LAB_0020edfc;
        }
      }
      operator==();
      goto LAB_0020ee0e;
    }
  }
  else {
LAB_0020ee0e:
    operator==();
LAB_0020ee13:
    operator==();
  }
  operator==();
  if ((slot_type *)b == (slot_type *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
    ::erase();
  }
  else if (b != (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
          ) {
    if (-1 < (char)*(code *)b) {
      pvVar5 = *(void **)(extraout_RDX + 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)(extraout_RDX + 0x18) - (long)pvVar5);
      }
      uVar10 = absl::lts_20240722::container_internal::EraseMetaOnly
                         ((CommonFields *)a,
                          (long)b - (long)(((value_type *)a)->second).
                                          super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,0x20);
      return (bool)uVar10;
    }
    goto LAB_0020ee7c;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
LAB_0020ee7c:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
  pLVar11 = (((value_type *)a)->second).
            super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pointer)0x1 < pLVar11) &&
     (pFVar6 = ((value_type *)a)->first, pFVar6 < (FileDescriptor *)0x11)) {
    if ((FileDescriptor *)0xe < pFVar6) {
      pLVar12 = (((value_type *)a)->second).
                super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pLVar11 = (pointer)((ulong)pLVar11 >> 1);
      do {
        auVar1._0_8_ = pLVar12->proto_features;
        auVar1._8_8_ = pLVar12->proto;
        bVar8 = (byte)((ulong)auVar1._8_8_ >> 0x38);
        uVar14 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                               (ushort)(bVar8 >> 7) << 0xf);
        if (uVar14 != 0xffff) {
          uVar14 = ~uVar14;
          do {
            uVar7 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (*(char *)((long)&pLVar12->proto_features + (ulong)uVar7) < '\0') {
              __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x764,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
            pLVar11 = (pointer)((long)&pLVar11[-1].filename._M_str + 7);
            uVar15 = (ushort)(uVar14 - 1) & (ushort)uVar14;
            uVar14 = CONCAT22((short)(uVar14 - 1 >> 0x10),uVar15);
          } while (uVar15 != 0);
          if (pLVar11 == (pointer)0x0) goto LAB_0020eea9;
        }
        pLVar12 = (pointer)&pLVar12->full_name;
        if (bVar8 == 0xff) {
          __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x76b,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
      } while( true );
    }
    if ((FileDescriptor *)0x8 < pFVar6) {
      __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x753,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                   );
    }
  }
LAB_0020eea9:
  return SUB81(pLVar11,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }